

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O0

LIndex IndexTools::IndividualToJointIndicesArrayStepSize
                 (LIndex *indices,LIndex *step_size,size_t vec_size)

{
  Index i;
  LIndex jointI;
  size_t vec_size_local;
  LIndex *step_size_local;
  LIndex *indices_local;
  
  jointI = 0;
  for (i = 0; i < vec_size; i = i + 1) {
    jointI = indices[i] * step_size[i] + jointI;
  }
  return jointI;
}

Assistant:

LIndex IndexTools::IndividualToJointIndicesArrayStepSize(LIndex* indices,
        const LIndex* step_size, size_t vec_size) 
{
    LIndex jointI = 0;
    for(Index i=0; i < vec_size ; i++)            
        jointI += indices[i] * step_size[i];

    return(jointI);
}